

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O3

void __thiscall
Bech32Test_verifyChecksum_good_Test::~Bech32Test_verifyChecksum_good_Test
          (Bech32Test_verifyChecksum_good_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, verifyChecksum_good) {
    std::string str("a1lqfn3a");
    std::string hrp = extractHumanReadablePart(str);
    std::vector<unsigned char> dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_TRUE(verifyChecksum(hrp, dp));

    str = "A1LQFN3A";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_TRUE(verifyChecksum(hrp, dp));

    str = "abcdef1l7aum6echk45nj3s0wdvt2fg8x9yrzpqzd3ryx";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_TRUE(verifyChecksum(hrp, dp));

    str = "split1checkupstagehandshakeupstreamerranterredcaperredlc445v";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_TRUE(verifyChecksum(hrp, dp));

    str = "an83characterlonghumanreadablepartthatcontainsthetheexcludedcharactersbioandnumber11sg7hg6";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_TRUE(verifyChecksum(hrp, dp));

    str = "11llllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllludsr8";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_TRUE(verifyChecksum(hrp, dp));

}